

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

String * __thiscall
capnp::JsonCodec::Impl::encodeString(String *__return_storage_ptr__,Impl *this,StringPtr chars)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  char *pcVar4;
  byte *pbVar5;
  size_t sVar6;
  long lVar7;
  Vector<char> local_58;
  String *local_38;
  
  sVar2 = chars.content.size_;
  pcVar4 = chars.content.ptr;
  local_38 = __return_storage_ptr__;
  local_58.builder.ptr =
       (char *)kj::_::HeapArrayDisposer::allocateImpl
                         (1,0,sVar2 + 2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_58.builder.endPtr = (char *)((byte *)local_58.builder.ptr + sVar2 + 2);
  local_58.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_58.builder.pos = local_58.builder.ptr;
  if (sVar2 + 2 == 0) {
    kj::Vector<char>::setCapacity(&local_58,4);
  }
  *local_58.builder.pos = 0x22;
  local_58.builder.pos = local_58.builder.pos + 1;
  if (pcVar4 + (sVar2 - 1) != pcVar4) {
    lVar7 = 0;
    do {
      bVar1 = pcVar4[lVar7];
      switch(bVar1) {
      case 8:
        pbVar3 = (byte *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar3) {
          pbVar5 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pbVar5 = (byte *)0x4;
          }
          if (pbVar5 < pbVar3) {
            pbVar5 = pbVar3;
          }
          kj::Vector<char>::setCapacity(&local_58,(size_t)pbVar5);
        }
        ((byte *)local_58.builder.pos)[0] = 0x5c;
        ((byte *)local_58.builder.pos)[1] = 0x62;
        break;
      case 9:
        pbVar3 = (byte *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar3) {
          pbVar5 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pbVar5 = (byte *)0x4;
          }
          if (pbVar5 < pbVar3) {
            pbVar5 = pbVar3;
          }
          kj::Vector<char>::setCapacity(&local_58,(size_t)pbVar5);
        }
        ((byte *)local_58.builder.pos)[0] = 0x5c;
        ((byte *)local_58.builder.pos)[1] = 0x74;
        break;
      case 10:
        pbVar3 = (byte *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar3) {
          pbVar5 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pbVar5 = (byte *)0x4;
          }
          if (pbVar5 < pbVar3) {
            pbVar5 = pbVar3;
          }
          kj::Vector<char>::setCapacity(&local_58,(size_t)pbVar5);
        }
        ((byte *)local_58.builder.pos)[0] = 0x5c;
        ((byte *)local_58.builder.pos)[1] = 0x6e;
        break;
      case 0xb:
switchD_0038cff8_caseD_b:
        if (bVar1 < 0x20) {
          pbVar3 = (byte *)local_58.builder.pos + (4 - (long)local_58.builder.ptr);
          if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar3) {
            pbVar5 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              pbVar5 = (byte *)0x4;
            }
            if (pbVar5 < pbVar3) {
              pbVar5 = pbVar3;
            }
            kj::Vector<char>::setCapacity(&local_58,(size_t)pbVar5);
          }
          ((byte *)local_58.builder.pos)[0] = 0x5c;
          ((byte *)local_58.builder.pos)[1] = 0x75;
          ((byte *)local_58.builder.pos)[2] = 0x30;
          ((byte *)local_58.builder.pos)[3] = 0x30;
          local_58.builder.pos = (RemoveConst<char> *)((byte *)local_58.builder.pos + 4);
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar6 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.pos == local_58.builder.ptr) {
              sVar6 = 4;
            }
            kj::Vector<char>::setCapacity(&local_58,sVar6);
          }
          *local_58.builder.pos = "0123456789abcdef"[bVar1 >> 4];
          local_58.builder.pos = local_58.builder.pos + 1;
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar6 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.pos == local_58.builder.ptr) {
              sVar6 = 4;
            }
            kj::Vector<char>::setCapacity(&local_58,sVar6);
          }
          *local_58.builder.pos = "0123456789abcdef"[bVar1 & 0xf];
        }
        else {
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar6 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.pos == local_58.builder.ptr) {
              sVar6 = 4;
            }
            kj::Vector<char>::setCapacity(&local_58,sVar6);
          }
          *local_58.builder.pos = bVar1;
        }
        local_58.builder.pos = local_58.builder.pos + 1;
        goto LAB_0038d2f8;
      case 0xc:
        pbVar3 = (byte *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar3) {
          pbVar5 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pbVar5 = (byte *)0x4;
          }
          if (pbVar5 < pbVar3) {
            pbVar5 = pbVar3;
          }
          kj::Vector<char>::setCapacity(&local_58,(size_t)pbVar5);
        }
        ((byte *)local_58.builder.pos)[0] = 0x5c;
        ((byte *)local_58.builder.pos)[1] = 0x66;
        break;
      case 0xd:
        pbVar3 = (byte *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar3) {
          pbVar5 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pbVar5 = (byte *)0x4;
          }
          if (pbVar5 < pbVar3) {
            pbVar5 = pbVar3;
          }
          kj::Vector<char>::setCapacity(&local_58,(size_t)pbVar5);
        }
        ((byte *)local_58.builder.pos)[0] = 0x5c;
        ((byte *)local_58.builder.pos)[1] = 0x72;
        break;
      default:
        if (bVar1 == 0x5c) {
          pbVar3 = (byte *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
          if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar3) {
            pbVar5 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              pbVar5 = (byte *)0x4;
            }
            if (pbVar5 < pbVar3) {
              pbVar5 = pbVar3;
            }
            kj::Vector<char>::setCapacity(&local_58,(size_t)pbVar5);
          }
          ((byte *)local_58.builder.pos)[0] = 0x5c;
          ((byte *)local_58.builder.pos)[1] = 0x5c;
        }
        else {
          if (bVar1 != 0x22) goto switchD_0038cff8_caseD_b;
          pbVar3 = (byte *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
          if (local_58.builder.endPtr + -(long)local_58.builder.ptr < pbVar3) {
            pbVar5 = (byte *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              pbVar5 = (byte *)0x4;
            }
            if (pbVar5 < pbVar3) {
              pbVar5 = pbVar3;
            }
            kj::Vector<char>::setCapacity(&local_58,(size_t)pbVar5);
          }
          ((byte *)local_58.builder.pos)[0] = 0x5c;
          ((byte *)local_58.builder.pos)[1] = 0x22;
        }
      }
      local_58.builder.pos = (RemoveConst<char> *)((byte *)local_58.builder.pos + 2);
LAB_0038d2f8:
      lVar7 = lVar7 + 1;
    } while (sVar2 - 1 != lVar7);
  }
  if (local_58.builder.pos == local_58.builder.endPtr) {
    sVar2 = 4;
    if (local_58.builder.pos != local_58.builder.ptr) {
      sVar2 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
    }
    kj::Vector<char>::setCapacity(&local_58,sVar2);
  }
  *local_58.builder.pos = 0x22;
  local_58.builder.pos = local_58.builder.pos + 1;
  if (local_58.builder.pos == local_58.builder.endPtr) {
    sVar2 = 4;
    if (local_58.builder.pos != local_58.builder.ptr) {
      sVar2 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
    }
    kj::Vector<char>::setCapacity(&local_58,sVar2);
  }
  *local_58.builder.pos = 0;
  local_58.builder.pos = local_58.builder.pos + 1;
  if (local_58.builder.pos != local_58.builder.endPtr) {
    kj::Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr)
    ;
  }
  (local_38->content).ptr = local_58.builder.ptr;
  (local_38->content).size_ = (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (local_38->content).disposer = local_58.builder.disposer;
  return local_38;
}

Assistant:

kj::String encodeString(kj::StringPtr chars) const {
    static const char HEXDIGITS[] = "0123456789abcdef";
    kj::Vector<char> escaped(chars.size() + 3);

    escaped.add('"');
    for (char c: chars) {
      switch (c) {
        case '\"': escaped.addAll(kj::StringPtr("\\\"")); break;
        case '\\': escaped.addAll(kj::StringPtr("\\\\")); break;
        case '\b': escaped.addAll(kj::StringPtr("\\b")); break;
        case '\f': escaped.addAll(kj::StringPtr("\\f")); break;
        case '\n': escaped.addAll(kj::StringPtr("\\n")); break;
        case '\r': escaped.addAll(kj::StringPtr("\\r")); break;
        case '\t': escaped.addAll(kj::StringPtr("\\t")); break;
        default:
          if (static_cast<uint8_t>(c) < 0x20) {
            escaped.addAll(kj::StringPtr("\\u00"));
            uint8_t c2 = c;
            escaped.add(HEXDIGITS[c2 / 16]);
            escaped.add(HEXDIGITS[c2 % 16]);
          } else {
            escaped.add(c);
          }
          break;
      }
    }
    escaped.add('"');
    escaped.add('\0');

    return kj::String(escaped.releaseAsArray());
  }